

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threads.cpp
# Opt level: O0

PSNodeFork * __thiscall
dg::pta::LLVMPointerGraphBuilder::createForkNode
          (LLVMPointerGraphBuilder *this,CallInst *CInst,PSNode *callNode)

{
  PSNode *function;
  PSNodeFork *this_00;
  PSNodeFork *forkNode_00;
  ret_type pFVar1;
  PSNode *in_RDX;
  PSNode *in_RSI;
  PSNode *in_RDI;
  LLVMPointerGraphBuilder *unaff_retaddr;
  Function *func;
  Value *spawnedFunc;
  PSNodeFork *forkNode;
  uint in_stack_ffffffffffffffbc;
  LLVMPointerGraphBuilder *in_stack_ffffffffffffffc8;
  vector<dg::pta::PSNodeFork_*,_std::allocator<dg::pta::PSNodeFork_*>_> *in_stack_ffffffffffffffd0;
  PSNode *CI;
  
  CI = in_RDI;
  llvm::CallBase::getArgOperand((CallBase *)in_RDI,in_stack_ffffffffffffffbc);
  function = getOperand(in_stack_ffffffffffffffc8,(Value *)in_RDI);
  PointerGraph::create<(dg::pta::PSNodeType)13,dg::pta::PSNode*>
            ((PointerGraph *)in_stack_ffffffffffffffd0,(PSNode **)in_stack_ffffffffffffffc8);
  this_00 = PSNodeFork::get(in_RDI);
  PSNode::setPairedNode(in_RDX,&this_00->super_PSNode);
  PSNode::setPairedNode(&this_00->super_PSNode,in_RDX);
  PSNodeFork::setCallInst(this_00,in_RDX);
  std::vector<dg::pta::PSNodeFork_*,_std::allocator<dg::pta::PSNodeFork_*>_>::push_back
            (in_stack_ffffffffffffffd0,(value_type *)in_stack_ffffffffffffffc8);
  addArgumentOperands(unaff_retaddr,(CallInst *)CI,in_RSI);
  llvm::CallBase::getArgOperand((CallBase *)in_RDI,in_stack_ffffffffffffffbc);
  forkNode_00 = (PSNodeFork *)llvm::Value::stripPointerCasts((Value *)0x1bc728);
  pFVar1 = llvm::dyn_cast<llvm::Function,llvm::Value_const>((Value *)in_RDI);
  if (pFVar1 != (ret_type)0x0) {
    getNodes((LLVMPointerGraphBuilder *)function,(Value *)forkNode_00);
    PSNodesSeq::getSingleNode((PSNodesSeq *)0x1bc75b);
    addFunctionToFork((LLVMPointerGraphBuilder *)this_00,function,forkNode_00);
  }
  return this_00;
}

Assistant:

PSNodeFork *LLVMPointerGraphBuilder::createForkNode(const llvm::CallInst *CInst,
                                                    PSNode *callNode) {
    using namespace llvm;
    PSNodeFork *forkNode = PSNodeFork::get(
            PS.create<PSNodeType::FORK>(getOperand(CInst->getArgOperand(2))));
    callNode->setPairedNode(forkNode);
    forkNode->setPairedNode(callNode);

    forkNode->setCallInst(callNode);

    forkNodes.push_back(forkNode);
    addArgumentOperands(*CInst, *callNode);

    const Value *spawnedFunc = CInst->getArgOperand(2)->stripPointerCasts();
    if (const Function *func = dyn_cast<Function>(spawnedFunc)) {
        addFunctionToFork(getNodes(func)->getSingleNode(), forkNode);
    }

    return forkNode;
}